

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
 __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::
iterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::TypedTermList,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool>
          (SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *this,TypedTermList query,
          bool retrieveSubstitutions,bool reversed,AbstractingUnifier *args,AbstractionOracle args_1
          ,bool args_2)

{
  TypedTermList as_1;
  undefined8 in_RSI;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *in_RDI;
  undefined4 in_R9D;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_00000008;
  AbstractingUnifier *in_stack_fffffffffffffef0;
  AbstractingUnifier *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 uVar1;
  undefined1 as_6;
  undefined1 as_3;
  undefined1 as_2;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *a;
  AbstractionOracle as_5;
  undefined2 in_stack_ffffffffffffff50;
  byte bVar2;
  byte bVar3;
  undefined1 in_stack_ffffffffffffff54 [12];
  bool local_99;
  __uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
  in_stack_ffffffffffffff78;
  
  as_5._mode = (UnificationWithAbstraction)((ulong)in_RSI >> 0x20);
  uVar1 = (undefined1)in_R9D;
  as_6 = (undefined1)((uint)in_R9D >> 8);
  as_3 = (undefined1)((uint)in_R9D >> 0x10);
  as_2 = (undefined1)((uint)in_R9D >> 0x18);
  a = in_RDI;
  local_99 = isEmpty((SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)
                     in_stack_fffffffffffffef0);
  bVar3 = 0;
  bVar2 = 0;
  if (local_99) {
    Lib::
    VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
    ::getEmpty();
  }
  else {
    in_stack_fffffffffffffef0 = (AbstractingUnifier *)&stack0xffffffffffffff68;
    Kernel::AbstractingUnifier::AbstractingUnifier
              (in_stack_fffffffffffffef0,in_stack_ffffffffffffff08);
    as_1.super_TermList._content._2_1_ = bVar2;
    as_1.super_TermList._content._0_2_ = in_stack_ffffffffffffff50;
    as_1.super_TermList._content._3_1_ = bVar3;
    as_1._4_12_ = in_stack_ffffffffffffff54;
    Lib::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
    ::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node*,Kernel::TypedTermList,bool,bool,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool>
              (in_stack_00000008,a,(Node *)in_RDI,as_1,(bool)as_2,(bool)as_3,
               (AbstractingUnifier *)
               in_stack_ffffffffffffff78._M_t.
               super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
               .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl,as_5
               ,(bool)as_6);
    bVar3 = 1;
    Lib::
    iterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
              ((Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)CONCAT17(as_2,CONCAT16(as_3,CONCAT15(as_6,CONCAT14(uVar1,in_stack_ffffffffffffff28
                                                                    )))));
    bVar2 = 1;
    Lib::
    pvi<Lib::IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>>>
              ((IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
                *)a);
  }
  local_99 = !local_99;
  if ((bVar2 & 1) != 0) {
    Lib::
    IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
    ::~IterTraits((IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
                   *)0x410339);
  }
  if ((bVar3 & 1) != 0) {
    Lib::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)in_RDI);
  }
  if (local_99) {
    Kernel::AbstractingUnifier::~AbstractingUnifier(in_stack_fffffffffffffef0);
  }
  return (VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
          )(IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
            *)a;
}

Assistant:

auto iterator(TermOrLit query, bool retrieveSubstitutions, bool reversed, Args... args)
  { return isEmpty() ? VirtualIterator<ELEMENT_TYPE(I)>::getEmpty()
                     : pvi(iterPointer(Recycled<I>(this, _root, query, retrieveSubstitutions, reversed, std::move(args)...)));
  }